

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O1

bool absl::raw_logging_internal::anon_unknown_0::DoRawLog(char **buf,int *size,char *format,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &ap[0].overflow_arg_area;
  local_e8 = 0x3000000018;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  uVar1 = vsnprintf(*buf,(long)*size,format,&local_e8);
  if ((-1 < (int)uVar1) && ((int)uVar1 <= *size)) {
    *size = *size - uVar1;
    *buf = *buf + uVar1;
  }
  return SUB41(uVar1,0);
}

Assistant:

bool DoRawLog(char** buf, int* size, const char* format, ...) {
  va_list ap;
  va_start(ap, format);
  int n = vsnprintf(*buf, *size, format, ap);
  va_end(ap);
  if (n < 0 || n > *size) return false;
  *size -= n;
  *buf += n;
  return true;
}